

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::_::CoroutineBase::tracePromise(CoroutineBase *this,TraceBuilder *builder,bool stopAtNextEvent)

{
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *this_00;
  PromiseNode *pPVar1;
  void *addr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *promise;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *_promise3214;
  bool stopAtNextEvent_local;
  TraceBuilder *builder_local;
  CoroutineBase *this_local;
  
  if (!stopAtNextEvent) {
    this_00 = readMaybe<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>
                        (&this->promiseNodeForTrace);
    if (this_00 != (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)0x0) {
      pPVar1 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator->(this_00);
      (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[4])
                (pPVar1,builder,(ulong)stopAtNextEvent);
    }
    addr = GetFunctorStartAddress<>::apply<std::__n4861::coroutine_handle<void>&>(&this->coroutine);
    TraceBuilder::add(builder,addr);
  }
  return;
}

Assistant:

void CoroutineBase::tracePromise(TraceBuilder& builder, bool stopAtNextEvent) {
  if (stopAtNextEvent) return;

  KJ_IF_SOME(promise, promiseNodeForTrace) {
    promise->tracePromise(builder, stopAtNextEvent);
  }

  // Maybe returning the address of coroutine() will give us a function name with meaningful type
  // information. (Narrator: It doesn't.)
  builder.add(GetFunctorStartAddress<>::apply(coroutine));
}